

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# card.h
# Opt level: O2

string * __thiscall card::getName_abi_cxx11_(string *__return_storage_ptr__,card *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name);
  return __return_storage_ptr__;
}

Assistant:

string card::getName() const { return name; }